

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_test.cc
# Opt level: O2

void __thiscall BLAKE2B256Test_ABC_Test::TestBody(BLAKE2B256Test_ABC_Test *this)

{
  char *message;
  Bytes local_88;
  Bytes local_78;
  AssertionResult gtest_ar;
  uint8_t digest [32];
  uint8_t kExpected [32];
  
  kExpected[0x10] = 0x94;
  kExpected[0x11] = 0x96;
  kExpected[0x12] = 'N';
  kExpected[0x13] = ';';
  kExpected[0x14] = 0xb1;
  kExpected[0x15] = 0xcb;
  kExpected[0x16] = '>';
  kExpected[0x17] = 'B';
  kExpected[0x18] = 'r';
  kExpected[0x19] = 'b';
  kExpected[0x1a] = 200;
  kExpected[0x1b] = 0xc0;
  kExpected[0x1c] = 'h';
  kExpected[0x1d] = 0xd5;
  kExpected[0x1e] = '#';
  kExpected[0x1f] = '\x19';
  kExpected[0] = 0xbd;
  kExpected[1] = 0xdd;
  kExpected[2] = 0x81;
  kExpected[3] = '<';
  kExpected[4] = 'c';
  kExpected[5] = 'B';
  kExpected[6] = '9';
  kExpected[7] = 'r';
  kExpected[8] = '1';
  kExpected[9] = 'q';
  kExpected[10] = 0xef;
  kExpected[0xb] = '?';
  kExpected[0xc] = 0xee;
  kExpected[0xd] = 0x98;
  kExpected[0xe] = 'W';
  kExpected[0xf] = 0x9b;
  BLAKE2B256((uint8_t *)"abc",3,digest);
  local_78.span_.size_ = 0x20;
  local_88.span_.size_ = 0x20;
  local_88.span_.data_ = digest;
  local_78.span_.data_ = kExpected;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)&gtest_ar,"Bytes(kExpected)","Bytes(digest)",&local_78,&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/blake2/blake2_test.cc"
               ,0x21,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_78.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.span_.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(BLAKE2B256Test, ABC) {
  // https://tools.ietf.org/html/rfc7693#appendix-A, except updated for the
  // 256-bit hash output.
  const uint8_t kExpected[] = {
      0xbd, 0xdd, 0x81, 0x3c, 0x63, 0x42, 0x39, 0x72, 0x31, 0x71, 0xef,
      0x3f, 0xee, 0x98, 0x57, 0x9b, 0x94, 0x96, 0x4e, 0x3b, 0xb1, 0xcb,
      0x3e, 0x42, 0x72, 0x62, 0xc8, 0xc0, 0x68, 0xd5, 0x23, 0x19,
  };

  uint8_t digest[BLAKE2B256_DIGEST_LENGTH];
  BLAKE2B256((const uint8_t *)"abc", 3, digest);
  EXPECT_EQ(Bytes(kExpected), Bytes(digest));
}